

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseEventModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> _Var2;
  _func_int **pp_Var3;
  Enum EVar4;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> local_70;
  Token local_68;
  
  RVar1 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_68,this);
  _Var2._M_head_impl = (EventModuleField *)operator_new(0xe0);
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
  filename.data_ = local_68.loc.filename.data_;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
  filename.size_ = local_68.loc.filename.size_;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc.
  field_1.field_1.offset = (size_t)local_68.loc.field_1.field_1.offset;
  *(undefined8 *)
   ((long)&((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
           super_ModuleField.loc.field_1 + 8) = local_68.loc.field_1._8_8_;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.type_
       = Event;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__EventModuleField_001bf118;
  Event::Event(&(_Var2._M_head_impl)->event,(string_view)ZEXT816(0));
  RVar1 = Expect(this,Event);
  if (RVar1.enum_ != Error) {
    ParseBindVarOpt(this,&((_Var2._M_head_impl)->event).name);
    RVar1 = ParseTypeUseOpt(this,&((_Var2._M_head_impl)->event).decl);
    if (((RVar1.enum_ != Error) &&
        (RVar1 = ParseUnboundFuncSignature(this,&((_Var2._M_head_impl)->event).decl.sig),
        RVar1.enum_ != Error)) && (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
      local_70._M_head_impl = _Var2._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                                  *)&local_70);
      EVar4 = Ok;
      if (local_70._M_head_impl == (EventModuleField *)0x0) {
        return (Result)Ok;
      }
      pp_Var3 = ((local_70._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                super_ModuleField._vptr_ModuleField;
      _Var2._M_head_impl = local_70._M_head_impl;
      goto LAB_00168f02;
    }
  }
  pp_Var3 = ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
            super_ModuleField._vptr_ModuleField;
LAB_00168f02:
  (*pp_Var3[1])(_Var2._M_head_impl);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseEventModuleField(Module* module) {
  WABT_TRACE(ParseEventModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<EventModuleField>(GetLocation());
  EXPECT(Event);
  ParseBindVarOpt(&field->event.name);
  CHECK_RESULT(ParseTypeUseOpt(&field->event.decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&field->event.decl.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}